

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::M3DImporter::importBones(M3DImporter *this,M3DWrapper *m3d,uint parentid,aiNode *pParent)

{
  m3db_t *pmVar1;
  aiNode *paVar2;
  Logger *this_00;
  ostream *this_01;
  aiNode **ppaVar3;
  aiNode *this_02;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  M3DImporter *this_03;
  size_t __n;
  M3DWrapper *m3d_00;
  ulong uVar7;
  ulong uVar8;
  allocator<char> local_481;
  M3DWrapper *local_480;
  aiNode *local_478;
  ulong local_470;
  M3DImporter *local_468;
  ulong local_460;
  undefined1 local_458 [36];
  undefined1 local_434 [1028];
  
  local_478 = pParent;
  if (pParent == (aiNode *)0x0) {
    __assert_fail("pParent != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x1e4,
                  "void Assimp::M3DImporter::importBones(const M3DWrapper &, unsigned int, aiNode *)"
                 );
  }
  if (this->mScene != (aiScene *)0x0) {
    local_468 = this;
    if (m3d->m3d_ != (m3d_t *)0x0) {
      uVar7 = (ulong)parentid;
      this_00 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[18]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_458 + 0x20),(char (*) [18])"M3D: importBones ");
      local_480 = m3d;
      this_01 = (ostream *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          (local_458 + 0x20),&m3d->m3d_->numbone);
      std::operator<<(this_01," parentid ");
      std::ostream::operator<<(this_01,parentid);
      std::__cxx11::stringbuf::str();
      Logger::debug(this_00,(char *)local_458._0_8_);
      std::__cxx11::string::~string((string *)local_458);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_458 + 0x20));
      m3d_00 = local_480;
      uVar8 = (ulong)(parentid + 1);
      lVar5 = uVar8 * 0x68;
      uVar4 = 0;
      for (uVar6 = uVar8; uVar6 < local_480->m3d_->numbone; uVar6 = uVar6 + 1) {
        uVar4 = uVar4 + (*(uint *)((long)local_480->m3d_->bone->mat4 + lVar5 + -0x28) == parentid);
        lVar5 = lVar5 + 0x68;
      }
      ppaVar3 = (aiNode **)operator_new__((ulong)uVar4 << 3);
      local_478->mChildren = ppaVar3;
      lVar5 = uVar8 * 0x68;
      local_470 = uVar7;
      for (; uVar8 < m3d_00->m3d_->numbone; uVar8 = uVar8 + 1) {
        if (*(int *)((long)m3d_00->m3d_->bone->mat4 + lVar5 + -0x28) == (int)uVar7) {
          local_460 = uVar8;
          this_02 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_02);
          paVar2 = local_478;
          this_02->mParent = local_478;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_458,*(char **)((long)m3d_00->m3d_->bone->mat4 + lVar5 + -0x20),
                     &local_481);
          __n = local_458._8_8_ & 0xffffffff;
          if ((local_458._8_8_ & 0xfffffc00) != 0) {
            __n = 0x3ff;
          }
          memcpy(local_434,(void *)local_458._0_8_,__n);
          local_434[__n] = 0;
          (this_02->mName).length = (ai_uint32)__n;
          memcpy((this_02->mName).data,local_434,__n);
          m3d_00 = local_480;
          (this_02->mName).data[__n] = '\0';
          this_03 = (M3DImporter *)local_458;
          std::__cxx11::string::~string((string *)this_03);
          pmVar1 = m3d_00->m3d_->bone;
          convertPose(this_03,m3d_00,&this_02->mTransformation,
                      *(uint *)((long)pmVar1->mat4 + lVar5 + -0x18),
                      *(uint *)((long)pmVar1->mat4 + lVar5 + -0x14));
          uVar8 = local_460;
          this_02->mNumChildren = 0;
          paVar2->mChildren[paVar2->mNumChildren] = this_02;
          paVar2->mNumChildren = paVar2->mNumChildren + 1;
          importBones(local_468,m3d_00,(uint)local_460,this_02);
          uVar7 = local_470;
        }
        lVar5 = lVar5 + 0x68;
      }
      return;
    }
    __assert_fail("m3d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                  ,0x1e6,
                  "void Assimp::M3DImporter::importBones(const M3DWrapper &, unsigned int, aiNode *)"
                 );
  }
  __assert_fail("mScene != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/M3D/M3DImporter.cpp"
                ,0x1e5,
                "void Assimp::M3DImporter::importBones(const M3DWrapper &, unsigned int, aiNode *)")
  ;
}

Assistant:

void M3DImporter::importBones(const M3DWrapper &m3d, unsigned int parentid, aiNode *pParent) {
	unsigned int i, n;

	ai_assert(pParent != nullptr);
	ai_assert(mScene != nullptr);
	ai_assert(m3d);

	ASSIMP_LOG_DEBUG_F("M3D: importBones ", m3d->numbone, " parentid ", (int)parentid);

	for (n = 0, i = parentid + 1; i < m3d->numbone; i++)
		if (m3d->bone[i].parent == parentid) n++;
	pParent->mChildren = new aiNode *[n];

	for (i = parentid + 1; i < m3d->numbone; i++) {
		if (m3d->bone[i].parent == parentid) {
			aiNode *pChild = new aiNode;
			pChild->mParent = pParent;
			pChild->mName = aiString(std::string(m3d->bone[i].name));
			convertPose(m3d, &pChild->mTransformation, m3d->bone[i].pos, m3d->bone[i].ori);
			pChild->mNumChildren = 0;
			pParent->mChildren[pParent->mNumChildren] = pChild;
			pParent->mNumChildren++;
			importBones(m3d, i, pChild);
		}
	}
}